

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O1

void speech_prog_cimar_dollgirl(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  short *psVar1;
  short sVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  char buf [4608];
  char acStack_1228 [4616];
  
  bVar4 = is_npc(ch);
  if (!bVar4) {
    bVar4 = can_see(mob,ch);
    if (bVar4) {
      bVar4 = can_do_quest(ch,1);
      if (bVar4) {
        sVar2 = ch->pcdata->quests[1];
        if (sVar2 == 1) {
          bVar4 = str_prefix("yes",speech);
          if (bVar4) {
            bVar4 = str_prefix("no",speech);
            if (!bVar4) {
              do_emote(mob,"sniffs and continues crying loudly, wailing into a corner.");
              return;
            }
          }
          else {
            bVar4 = is_carrying(ch,0x8fa);
            if (bVar4) {
              do_emote(mob,"squeaks with delight and extends one wavering hand.");
              do_say(mob,"Please?");
              return;
            }
            act("$n stops crying suddenly and studies your face for a moment.",mob,(void *)0x0,ch,2)
            ;
            act("$n stops crying suddenly and studies $N\'s face for a moment.",mob,(void *)0x0,ch,1
               );
            do_say(mob,"Why... would you l-lie to me?  W-why?");
            act("$n turns away from you and wails pitifully.",mob,(void *)0x0,ch,2);
            act("$n turns away from $N and wails pitifully.",mob,(void *)0x0,ch,1);
            pPVar3 = ch->pcdata;
            pPVar3->quests[1] = 3;
            psVar1 = &pPVar3->reputation;
            *psVar1 = *psVar1 + -0xf;
          }
        }
        else if (sVar2 == 0) {
          bVar4 = str_prefix("yes",speech);
          if (bVar4) {
            bVar4 = str_prefix("no",speech);
            if (!bVar4) {
              act("A brief look of shock crosses $n\'s face and she turns away, sobbing.",mob,
                  (void *)0x0,(void *)0x0,0);
              pPVar3 = ch->pcdata;
              pPVar3->quests[1] = 2;
              psVar1 = &pPVar3->reputation;
              *psVar1 = *psVar1 + -10;
            }
          }
          else {
            do_emote(mob,"\'s eyes light up and gleam with hope.");
            act("$n approaches $N and murmurs something to $M.",mob,(void *)0x0,ch,1);
            pcVar5 = get_char_color(ch,"speech");
            pcVar6 = END_COLOR(ch);
            sprintf(acStack_1228,
                    "A red-eyed girl says \'%sI lost it somewhere on Wormwood Avenue... I saw a rat, and it tried to bite me, so I ran away... and I think I dropped my doll somewhere b-by the sewer g-grate....%s\'\n\r"
                    ,pcVar5,pcVar6);
            send_to_char(acStack_1228,ch);
            do_emote(mob,"begins to bawl once more.");
            ch->pcdata->quests[1] = 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void speech_prog_cimar_dollgirl(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (!can_see(mob, ch))
		return;

	if (!can_do_quest(ch, DOLL_QUEST))
		return;

	switch (ch->pcdata->quests[DOLL_QUEST])
	{
		case 0:
			if (!str_prefix("yes", speech))
			{
				do_emote(mob, "'s eyes light up and gleam with hope.");
				act("$n approaches $N and murmurs something to $M.", mob, 0, ch, TO_NOTVICT);

				sprintf(buf,
					"A red-eyed girl says '%sI lost it somewhere on Wormwood Avenue... I saw a rat, and it tried to bite "\
					"me, so I ran away... and I think I dropped my doll somewhere b-by the sewer g-grate....%s'\n\r",
					get_char_color(ch, "speech"), END_COLOR(ch));
				send_to_char(buf, ch);

				do_emote(mob, "begins to bawl once more.");

				ch->pcdata->quests[DOLL_QUEST] = 1;
				break;
			}

			if (!str_prefix("no", speech))
			{
				act("A brief look of shock crosses $n's face and she turns away, sobbing.", mob, 0, 0, TO_ROOM);

				ch->pcdata->quests[DOLL_QUEST] = 2;
				ch->pcdata->reputation -= 10;
				break;
			}

			break;
		case 1:
			if (!str_prefix("yes", speech))
			{
				if (is_carrying(ch, 2298))
				{
					do_emote(mob, "squeaks with delight and extends one wavering hand.");
					do_say(mob, "Please?");
				}
				else
				{
					act("$n stops crying suddenly and studies your face for a moment.", mob, 0, ch, TO_VICT);
					act("$n stops crying suddenly and studies $N's face for a moment.", mob, 0, ch, TO_NOTVICT);
					do_say(mob, "Why... would you l-lie to me?  W-why?");

					act("$n turns away from you and wails pitifully.", mob, 0, ch, TO_VICT);
					act("$n turns away from $N and wails pitifully.", mob, 0, ch, TO_NOTVICT);

					ch->pcdata->quests[DOLL_QUEST] = 3;
					ch->pcdata->reputation -= 15;
				}

				break;
			}

			if (!str_prefix("no", speech))
			{
				do_emote(mob, "sniffs and continues crying loudly, wailing into a corner.");
				break;
			}
	}
}